

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::type_is_array_of_pointers(Compiler *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *local_28;
  SPIRType *parent;
  SPIRType *type_local;
  Compiler *this_local;
  
  bVar1 = is_array(this,type);
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    if (uVar2 == 0) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
      local_28 = get<diligent_spirv_cross::SPIRType>(this,uVar2);
      while( true ) {
        bVar1 = is_array(this,local_28);
        if (!bVar1) break;
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->parent_type);
        local_28 = get<diligent_spirv_cross::SPIRType>(this,uVar2);
      }
      this_local._7_1_ = is_pointer(this,local_28);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::type_is_array_of_pointers(const SPIRType &type) const
{
	if (!is_array(type))
		return false;

	// BDA types must have parent type hierarchy.
	if (!type.parent_type)
		return false;

	// Punch through all array layers.
	auto *parent = &get<SPIRType>(type.parent_type);
	while (is_array(*parent))
		parent = &get<SPIRType>(parent->parent_type);

	return is_pointer(*parent);
}